

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdoptpfor.h
# Opt level: O1

uint32_t __thiscall
FastPForLib::SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>::tryB
          (SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t b,uint32_t *in,uint32_t len
          )

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  int in_EAX;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t e;
  uint uVar8;
  size_t encodedExceptions_sz;
  int local_18 [2];
  
  if (b != 0x20) {
    if (len == 0) {
      uVar5 = 0;
    }
    else {
      puVar2 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsPositions.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsValues.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = 0;
      uVar5 = 0;
      do {
        uVar8 = in[uVar7];
        if (uVar8 >> (b & 0x1f) != 0) {
          puVar2[uVar5] = (uint)uVar7;
          puVar3[uVar5] = uVar8 >> (b & 0x1f);
          uVar5 = uVar5 + 1;
        }
        uVar7 = uVar7 + 1;
      } while (len != uVar7);
    }
    len = len * b + 0x1f >> 5;
    if (uVar5 != 0) {
      if (uVar5 - 1 != 0) {
        puVar2 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsPositions.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (ulong)(uVar5 - 1);
        do {
          uVar6 = uVar7 - 1;
          puVar3 = puVar2 + uVar7;
          *puVar3 = *puVar3 - puVar2[uVar6 & 0xffffffff];
          uVar7 = uVar6;
        } while ((int)uVar6 != 0);
      }
      puVar2 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsPositions.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsValues.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptions.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = 0;
      do {
        if (uVar7 == 0) {
          uVar8 = *puVar2;
        }
        else {
          uVar8 = puVar2[uVar7] - 1;
        }
        uVar1 = puVar3[uVar7];
        puVar4[uVar7] = uVar8;
        puVar4[uVar5 + (int)uVar7] = uVar1 - 1;
        uVar7 = uVar7 + 1;
      } while (uVar5 + (uVar5 == 0) != uVar7);
      local_18[0] = in_EAX;
      Simple16<false>::fakeencodeArray
                (&(this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).ecoder,
                 (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptions.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,(ulong)(uVar5 * 2),(size_t *)local_18);
      len = len + local_18[0];
    }
  }
  return len;
}

Assistant:

__attribute__((pure)) uint32_t
SIMDOPTPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::tryB(
    uint32_t b, const uint32_t *in, uint32_t len) {

  assert(b <= 32);
  if (b == 32) {
    return len;
  }
  uint32_t size = div_roundup(len * b, 32);
  uint32_t curExcept = 0;

  for (uint32_t i = 0; i < len; i++) {
    if (in[i] >= (1U << b)) {
      const uint32_t e = in[i] >> b;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                  ExceptionCoder>::exceptionsPositions[curExcept] = i;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                  ExceptionCoder>::exceptionsValues[curExcept] = e;
      curExcept++;
    }
  }

  if (curExcept > 0) {

    for (uint32_t i = curExcept - 1; i > 0; i--) {
      const uint32_t cur = SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                                       ExceptionCoder>::exceptionsPositions[i];
      const uint32_t prev =
          SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                      ExceptionCoder>::exceptionsPositions[i - 1];
      const uint32_t gap = cur - prev;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                  ExceptionCoder>::exceptionsPositions[i] = gap;
    }

    for (uint32_t i = 0; i < curExcept; i++) {
      const uint32_t excPos =
          (i > 0)
              ? SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                            ExceptionCoder>::exceptionsPositions[i] -
                    1
              : SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                            ExceptionCoder>::exceptionsPositions[i];
      const uint32_t excVal = SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                                          ExceptionCoder>::exceptionsValues[i] -
                              1;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::exceptions[i] =
          excPos;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                  ExceptionCoder>::exceptions[i + curExcept] = excVal;
    }
    size_t encodedExceptions_sz;
    SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::ecoder
        .fakeencodeArray(&SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                                      ExceptionCoder>::exceptions[0],
                         2 * curExcept,
                         /*&encodedExceptions[0], */ encodedExceptions_sz);
    size += static_cast<uint32_t>(encodedExceptions_sz);
  }
  return size;
}